

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.hpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLDateTime::setBuffer(XMLDateTime *this,XMLCh *aString)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  ulong uVar3;
  XMLCh *__dest;
  
  reset(this);
  XVar2 = XMLString::stringLen(aString);
  do {
    uVar3 = XVar2;
    this->fEnd = uVar3;
    if (uVar3 == 0) {
      return;
    }
    XVar2 = uVar3 - 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)aString[uVar3 - 1]] < '\0');
  if (this->fBufferMaxLen < uVar3) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fBuffer);
    this->fBufferMaxLen = this->fEnd + 8;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,this->fEnd * 2 + 0x12);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar1);
    this->fBuffer = __dest;
    uVar3 = this->fEnd;
  }
  else {
    __dest = this->fBuffer;
  }
  memcpy(__dest,aString,uVar3 * 2);
  this->fBuffer[this->fEnd] = L'\0';
  return;
}

Assistant:

inline void XMLDateTime::setBuffer(const XMLCh* const aString)
{
    reset();

    fEnd = XMLString::stringLen(aString);

    for (; fEnd > 0; fEnd--)
    {
        if (!XMLChar1_0::isWhitespace(aString[fEnd - 1]))
            break;
    }

    if (fEnd > 0) {

        if (fEnd > fBufferMaxLen)
        {
            fMemoryManager->deallocate(fBuffer);
            fBufferMaxLen = fEnd + 8;
            fBuffer = (XMLCh*) fMemoryManager->allocate((fBufferMaxLen+1) * sizeof(XMLCh));
        }

        memcpy(fBuffer, aString, (fEnd) * sizeof(XMLCh));
        fBuffer[fEnd] = '\0';
    }
}